

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IStreamingReporter * __thiscall
Catch::LegacyReporterRegistrar<Catch::JunitReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  LegacyReporterAdapter *this_00;
  JunitReporter *this_01;
  Ptr<Catch::IReporter> local_20;
  
  this_00 = (LegacyReporterAdapter *)operator_new(0x18);
  this_01 = (JunitReporter *)operator_new(0x3a8);
  JunitReporter::JunitReporter(this_01,config);
  local_20.m_p = (IReporter *)this_01;
  (*(this_01->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[2])(this_01);
  LegacyReporterAdapter::LegacyReporterAdapter(this_00,&local_20);
  if ((JunitReporter *)local_20.m_p != (JunitReporter *)0x0) {
    (*(((SharedImpl<Catch::IReporter> *)&(local_20.m_p)->super_IShared)->super_IReporter).
      super_IShared.super_NonCopyable._vptr_NonCopyable[3])();
  }
  return (IStreamingReporter *)this_00;
}

Assistant:

virtual IStreamingReporter* create( ReporterConfig const& config ) const {
                return new LegacyReporterAdapter( new T( config ) );
            }